

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pig.cpp
# Opt level: O2

string * __thiscall Pig::dump_abi_cxx11_(string *__return_storage_ptr__,Pig *this)

{
  ostream *poVar1;
  allocator local_202;
  allocator local_201;
  string local_200;
  string local_1e0;
  string local_1c0;
  stringstream out;
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&out);
  if (this->_cursor != 0) {
    poVar1 = std::operator<<(local_190,"\x1b[37;42m");
    std::__cxx11::string::substr
              ((ulong)&local_200,
               (ulong)(this->_text).
                      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr);
    poVar1 = std::operator<<(poVar1,(string *)&local_200);
    std::operator<<(poVar1,"\x1b[0m");
    std::__cxx11::string::~string((string *)&local_200);
  }
  poVar1 = std::operator<<(local_190,"\x1b[37;41m");
  std::__cxx11::string::substr
            ((ulong)&local_200,
             (ulong)(this->_text).
                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr);
  poVar1 = std::operator<<(poVar1,(string *)&local_200);
  poVar1 = std::operator<<(poVar1,"\x1b[0m ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,'/');
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&local_1c0,"\n",&local_201);
  std::__cxx11::string::string((string *)&local_1e0,"\\n",&local_202);
  str_replace(__return_storage_ptr__,&local_200,&local_1c0,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  return __return_storage_ptr__;
}

Assistant:

std::string Pig::dump () const
{
  std::stringstream out;
  if (_cursor)
    out << "[37;42m"
        << _text->substr (0, _cursor)
        << "[0m";

  out << "[37;41m"
      << _text->substr (_cursor)
      << "[0m "
      << _cursor
      << '/'
      << _text->length ();

  return str_replace (out.str (), "\n", "\\n");
}